

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

bool * __thiscall cppcms::json::variant::get<bool>(variant *this)

{
  bad_value_cast *this_00;
  string local_40;
  
  if (this->type == is_boolean) {
    return (bool *)this;
  }
  this_00 = (bad_value_cast *)__cxa_allocate_exception(0x48);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"invalid type","");
  bad_value_cast::bad_value_cast(this_00,&local_40,is_boolean,this->type);
  __cxa_throw(this_00,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
}

Assistant:

T &get()
		{
			json_type expected = json_type_traits<T>::type;
			if(expected != type) 
				throw bad_value_cast("invalid type",expected,type);
			switch(type) {
			case is_undefined:
			case is_null:
				throw bad_value_cast("non-fetchable type",type);
			default:
				return *static_cast<T *>(ptr());
			}
		}